

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

void bcread_kgc(LexState *ls,GCproto *pt,MSize sizekgc)

{
  char *str;
  lua_State *plVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  GCstr *pGVar5;
  GCtab *pGVar6;
  void *pvVar7;
  undefined2 local_dc;
  lua_State *L;
  TValue *p_2;
  GCcdata *cd;
  CTSize sz;
  CTypeID id;
  char *p;
  MSize len;
  MSize tp;
  GCRef *kr;
  MSize i;
  MSize sizekgc_local;
  GCproto *pt_local;
  LexState *ls_local;
  uint32_t v_4;
  uint32_t v_3;
  uint32_t v_2;
  uint32_t v_1;
  uint32_t v;
  uint8_t *p_1;
  GCcdata *cd_1;
  
  _len = (ulong *)((pt->k).ptr64 + (ulong)sizekgc * -8);
  for (kr._0_4_ = 0; (uint)kr < sizekgc; kr._0_4_ = (uint)kr + 1) {
    uVar2 = lj_buf_ruleb128(&ls->p);
    if (uVar2 < 5) {
      if (uVar2 == 1) {
        pGVar6 = bcread_ktab(ls);
        *_len = (ulong)pGVar6;
      }
      else if (uVar2 == 0) {
        plVar1 = ls->L;
        if (plVar1->top <= (TValue *)((plVar1->stack).ptr64 + (long)ls->lastline)) {
          bcread_error(ls,LJ_ERR_BCBAD);
        }
        plVar1->top = plVar1->top + -1;
        *_len = plVar1->top->u64 & 0x7fffffffffff;
      }
      else {
        if (uVar2 == 4) {
          local_dc = 0x10;
        }
        else {
          local_dc = 0xc;
          if (uVar2 == 2) {
            local_dc = 0xb;
          }
        }
        uVar3 = 8;
        if (uVar2 == 4) {
          uVar3 = 0x10;
        }
        pvVar7 = lj_mem_newgco(ls->L,(ulong)uVar3 + 0x10);
        *(undefined1 *)((long)pvVar7 + 9) = 10;
        *(undefined2 *)((long)pvVar7 + 10) = local_dc;
        *_len = (ulong)pvVar7;
        uVar4 = lj_buf_ruleb128(&ls->p);
        *(uint32_t *)((long)pvVar7 + 0x10) = uVar4;
        uVar4 = lj_buf_ruleb128(&ls->p);
        *(uint32_t *)((long)pvVar7 + 0x14) = uVar4;
        if (uVar2 == 4) {
          uVar2 = lj_buf_ruleb128(&ls->p);
          *(uint32_t *)((long)pvVar7 + 0x18) = uVar2;
          uVar2 = lj_buf_ruleb128(&ls->p);
          *(uint32_t *)((long)pvVar7 + 0x1c) = uVar2;
        }
      }
    }
    else {
      str = ls->p;
      ls->p = ls->p + (uVar2 - 5);
      pGVar5 = lj_str_new(ls->L,str,(ulong)(uVar2 - 5));
      *_len = (ulong)pGVar5;
    }
    _len = _len + 1;
  }
  return;
}

Assistant:

static void bcread_kgc(LexState *ls, GCproto *pt, MSize sizekgc)
{
  MSize i;
  GCRef *kr = mref(pt->k, GCRef) - (ptrdiff_t)sizekgc;
  for (i = 0; i < sizekgc; i++, kr++) {
    MSize tp = bcread_uleb128(ls);
    if (tp >= BCDUMP_KGC_STR) {
      MSize len = tp - BCDUMP_KGC_STR;
      const char *p = (const char *)bcread_mem(ls, len);
      setgcref(*kr, obj2gco(lj_str_new(ls->L, p, len)));
    } else if (tp == BCDUMP_KGC_TAB) {
      setgcref(*kr, obj2gco(bcread_ktab(ls)));
#if LJ_HASFFI
    } else if (tp != BCDUMP_KGC_CHILD) {
      CTypeID id = tp == BCDUMP_KGC_COMPLEX ? CTID_COMPLEX_DOUBLE :
		   tp == BCDUMP_KGC_I64 ? CTID_INT64 : CTID_UINT64;
      CTSize sz = tp == BCDUMP_KGC_COMPLEX ? 16 : 8;
      GCcdata *cd = lj_cdata_new_(ls->L, id, sz);
      TValue *p = (TValue *)cdataptr(cd);
      setgcref(*kr, obj2gco(cd));
      p[0].u32.lo = bcread_uleb128(ls);
      p[0].u32.hi = bcread_uleb128(ls);
      if (tp == BCDUMP_KGC_COMPLEX) {
	p[1].u32.lo = bcread_uleb128(ls);
	p[1].u32.hi = bcread_uleb128(ls);
      }
#endif
    } else {
      lua_State *L = ls->L;
      lj_assertLS(tp == BCDUMP_KGC_CHILD, "bad constant type %d", tp);
      if (L->top <= bcread_oldtop(L, ls))  /* Stack underflow? */
	bcread_error(ls, LJ_ERR_BCBAD);
      L->top--;
      setgcref(*kr, obj2gco(protoV(L->top)));
    }
  }
}